

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_metadata
          (ConcurrentDatabase *this,uint8_t **data,size_t *size)

{
  ulong uVar1;
  uint8_t *puVar2;
  bool bVar3;
  size_t sVar4;
  size_t count;
  long lVar5;
  ulong uVar6;
  uint i;
  ResourceTag tag;
  uint64_t uVar7;
  uint64_t *total_count;
  
  lVar5 = 0;
  tag = RESOURCE_APPLICATION_INFO;
  do {
    sVar4 = get_total_num_hashes_for_tag(this,tag);
    lVar5 = lVar5 + sVar4;
    tag = tag + RESOURCE_SAMPLER;
  } while (tag != RESOURCE_COUNT);
  uVar1 = lVar5 * 8 + 0xb0;
  if (*size < uVar1) {
LAB_00145814:
    bVar3 = false;
  }
  else {
    puVar2 = *data;
    puVar2[0] = 'S';
    puVar2[1] = '\x11';
    puVar2[2] = 'Q';
    puVar2[3] = '\x05';
    puVar2[4] = '_';
    puVar2[5] = '\v';
    puVar2[6] = 0xb1;
    puVar2[7] = '\0';
    *(ulong *)(puVar2 + 8) = uVar1;
    total_count = (uint64_t *)(puVar2 + 0x18);
    uVar7 = 0xb0;
    uVar6 = 0xffffffffffffffff;
    do {
      total_count[-1] = uVar7;
      bVar3 = write_exported_concurrent_hashes
                        (this,(int)uVar6 + RESOURCE_SAMPLER,
                         (ExportedMetadataConcurrentPrimedBlock *)(*data + uVar7),total_count);
      if (!bVar3) goto LAB_00145814;
      uVar7 = uVar7 + *total_count * 8;
      uVar6 = uVar6 + 1;
      total_count = total_count + 2;
      bVar3 = 8 < uVar6;
    } while (uVar6 != 9);
    *data = *data + uVar1;
    *size = *size - uVar1;
  }
  return bVar3;
}

Assistant:

bool write_exported_concurrent_metadata(uint8_t *&data, size_t &size) const
	{
		size_t total_hashes = get_total_num_hashes();
		size_t required = sizeof(ExportedMetadataHeader) + total_hashes * sizeof(ExportedMetadataConcurrentPrimedBlock);
		if (size < required)
			return false;

		auto *header = reinterpret_cast<ExportedMetadataHeader *>(data);
		header->magic = ExportedMetadataMagicConcurrent;
		header->size = required;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = ResourceTag(i);
			header->lists[i].offset = offset;
			if (!write_exported_concurrent_hashes(tag, reinterpret_cast<ExportedMetadataConcurrentPrimedBlock *>(data + offset),
			                                      header->lists[i].count))
			{
				return false;
			}
			offset += header->lists[i].count * sizeof(ExportedMetadataConcurrentPrimedBlock);
		}

		data += required;
		size -= required;
		return true;
	}